

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_encode.cpp
# Opt level: O2

string_t __thiscall
duckdb::URLDecodeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (URLDecodeOperator *this,string_t input,Vector *result)

{
  Vector *vector;
  idx_t len;
  char *output;
  char *input_00;
  string_t result_str;
  anon_union_16_2_67f50693_for_value local_38;
  undefined8 local_28;
  char *local_20;
  
  local_20 = input.value._0_8_;
  input_00 = (char *)((long)&local_28 + 4);
  if (0xc < (uint)this) {
    input_00 = local_20;
  }
  local_28 = this;
  vector = (Vector *)StringUtil::URLDecodeSize(input_00,(ulong)this & 0xffffffff,false);
  local_38.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(input.value._8_8_,vector,len);
  output = local_38._8_8_;
  if (local_38._0_4_ < 0xd) {
    output = local_38.pointer.prefix;
  }
  StringUtil::URLDecodeBuffer(input_00,(ulong)this & 0xffffffff,output,false);
  string_t::Finalize((string_t *)&local_38.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_38.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_str = input.GetData();
		auto input_size = input.GetSize();
		idx_t result_length = StringUtil::URLDecodeSize(input_str, input_size);
		auto result_str = StringVector::EmptyString(result, result_length);
		StringUtil::URLDecodeBuffer(input_str, input_size, result_str.GetDataWriteable());
		result_str.Finalize();
		return result_str;
	}